

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

Entry * __thiscall
TTD::TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*>::FindSlotForId<true>
          (TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*> *this,unsigned_long id)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  Entry *curr;
  uint32 probeIndex;
  uint32 offset;
  uint32 primaryIndex;
  unsigned_long searchKey;
  unsigned_long id_local;
  TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*> *this_local;
  
  if ((this->m_h1Prime != 0) && (this->m_h2Prime != 0)) {
    if (this->m_hashArray == (Entry *)0x0) {
      TTDAbort_unrecoverable_error("Not valid!!");
    }
    uVar3 = id % (ulong)this->m_h1Prime;
    if (this->m_hashArray[uVar3].Key == 0) {
      this_local = (TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*> *)
                   (this->m_hashArray + uVar3);
    }
    else {
      iVar2 = (int)(id % (ulong)this->m_h2Prime);
      curr._4_4_ = (int)uVar3 + iVar2 & this->m_capacity - 1;
      while (this_local = (TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*> *)
                          (this->m_hashArray + curr._4_4_), lVar1._0_4_ = this_local->m_h1Prime,
            lVar1._4_4_ = this_local->m_h2Prime, lVar1 != 0) {
        curr._4_4_ = curr._4_4_ + 1 & this->m_capacity - 1;
        if (curr._4_4_ == ((int)uVar3 + iVar2 & this->m_capacity - 1)) {
          TTDAbort_unrecoverable_error("The key is not here (or we messed up).");
        }
      }
    }
    return (Entry *)this_local;
  }
  TTDAbort_unrecoverable_error("Not valid!!");
}

Assistant:

Entry* FindSlotForId(Tag id) const
        {
            TTDAssert(this->m_h1Prime != 0 && this->m_h2Prime != 0, "Not valid!!");
            TTDAssert(this->m_hashArray != nullptr, "Not valid!!");

            Tag searchKey = findEmpty ? 0 : id;

            //h1Prime is less than table size by construction so we dont need to re-index
            uint32 primaryIndex = TTD_DICTIONARY_HASH(id, this->m_h1Prime);
            if (this->m_hashArray[primaryIndex].Key == searchKey)
            {
                return (this->m_hashArray + primaryIndex);
            }

            //do a hash for the second offset to avoid clustering and then do linear probing
            uint32 offset = TTD_DICTIONARY_HASH(id, this->m_h2Prime);
            uint32 probeIndex = TTD_DICTIONARY_INDEX(primaryIndex + offset, this->m_capacity);
            while (true)
            {
                Entry* curr = (this->m_hashArray + probeIndex);
                if (curr->Key == searchKey)
                {
                    return curr;
                }
                probeIndex = TTD_DICTIONARY_INDEX(probeIndex + 1, this->m_capacity);

                TTDAssert(probeIndex != TTD_DICTIONARY_INDEX(primaryIndex + offset, this->m_capacity), "The key is not here (or we messed up).");
            }
        }